

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  void *in_stack_00000008;
  __m128i m;
  __m128i m_acbd_2;
  __m128i m_acbd;
  __m128i m_ac;
  __m128i m_i1;
  __m128i m_i0;
  int in_stack_00000070;
  int i;
  __m128i two_w;
  __m128i one_b;
  __m128i v_maxval;
  __m128i *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int iVar5;
  undefined1 auVar6 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  auVar6 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar6 = vpinsrw_avx(auVar6,0x40,2);
  auVar6 = vpinsrw_avx(auVar6,0x40,3);
  auVar6 = vpinsrw_avx(auVar6,0x40,4);
  auVar6 = vpinsrw_avx(auVar6,0x40,5);
  auVar6 = vpinsrw_avx(auVar6,0x40,6);
  vpinsrw_avx(auVar6,0x40,7);
  auVar6 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar6 = vpinsrb_avx(auVar6,1,2);
  auVar6 = vpinsrb_avx(auVar6,1,3);
  auVar6 = vpinsrb_avx(auVar6,1,4);
  auVar6 = vpinsrb_avx(auVar6,1,5);
  auVar6 = vpinsrb_avx(auVar6,1,6);
  auVar6 = vpinsrb_avx(auVar6,1,7);
  auVar6 = vpinsrb_avx(auVar6,1,8);
  auVar6 = vpinsrb_avx(auVar6,1,9);
  auVar6 = vpinsrb_avx(auVar6,1,10);
  auVar6 = vpinsrb_avx(auVar6,1,0xb);
  auVar6 = vpinsrb_avx(auVar6,1,0xc);
  auVar6 = vpinsrb_avx(auVar6,1,0xd);
  auVar6 = vpinsrb_avx(auVar6,1,0xe);
  auVar6 = vpinsrb_avx(auVar6,1,0xf);
  local_28 = auVar6._0_8_;
  uStack_20 = auVar6._8_8_;
  auVar6 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar6 = vpinsrw_avx(auVar6,2,2);
  auVar6 = vpinsrw_avx(auVar6,2,3);
  auVar6 = vpinsrw_avx(auVar6,2,4);
  auVar6 = vpinsrw_avx(auVar6,2,5);
  auVar6 = vpinsrw_avx(auVar6,2,6);
  auVar6 = vpinsrw_avx(auVar6,2,7);
  auVar4 = ZEXT1664(auVar6);
  for (iVar5 = 0; auVar2 = auVar4._0_16_, iVar5 < (int)m[1]; iVar5 = iVar5 + 1) {
    xx_loadu_128(in_stack_00000008);
    auVar3 = auVar2;
    xx_loadu_128((void *)((long)in_stack_00000008 + (ulong)(uint)m[0]));
    auVar3 = vpaddusb_avx(auVar2,auVar3);
    auVar1._8_8_ = uStack_20;
    auVar1._0_8_ = local_28;
    auVar3 = vpmaddubsw_avx(auVar3,auVar1);
    auVar3 = vpaddw_avx(auVar3,auVar6);
    auVar3 = vpsrlw_avx(auVar3,ZEXT416(2));
    auVar4 = ZEXT1664(auVar3);
    blend_a64_d16_mask_w8_sse41
              (local_28,auVar6._8_8_,auVar6._0_8_,
               (__m128i *)CONCAT44(iVar5,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88,
               auVar2._8_8_,in_stack_00000070);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)((uint)m[0] << 1));
  }
  return;
}

Assistant:

static inline void aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i one_b = _mm_set1_epi8(1);
  const __m128i two_w = _mm_set1_epi16(2);
  for (int i = 0; i < h; ++i) {
    const __m128i m_i0 = xx_loadu_128(mask);
    const __m128i m_i1 = xx_loadu_128(mask + mask_stride);
    const __m128i m_ac = _mm_adds_epu8(m_i0, m_i1);
    const __m128i m_acbd = _mm_maddubs_epi16(m_ac, one_b);
    const __m128i m_acbd_2 = _mm_add_epi16(m_acbd, two_w);
    const __m128i m = _mm_srli_epi16(m_acbd_2, 2);

    blend_a64_d16_mask_w8_sse41(dst, src0, src1, &m, round_offset, &v_maxval,
                                shift);
    mask += mask_stride << 1;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}